

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpanel_bmod.c
# Opt level: O2

void dpanel_bmod(int m,int w,int jcol,int nseg,double *dense,double *tempv,int *segrep,int *repfnz,
                GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  int ncol;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  flops_t *pfVar7;
  int *piVar8;
  int *piVar9;
  int_t *piVar10;
  int_t *piVar11;
  void *pvVar12;
  int_t *piVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int *piVar21;
  double *pdVar22;
  int *piVar23;
  double *pdVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  double *pdVar37;
  int iVar38;
  long lVar39;
  ulong uVar40;
  int iVar41;
  int iVar42;
  int ldm;
  uint nrow;
  double dVar43;
  double dVar44;
  double dVar45;
  double *local_150;
  
  pfVar7 = stat->ops;
  piVar8 = Glu->xsup;
  piVar9 = Glu->supno;
  piVar10 = Glu->lsub;
  piVar11 = Glu->xlsub;
  pvVar12 = Glu->lusup;
  piVar13 = Glu->xlusup;
  iVar14 = sp_ienv(3);
  iVar15 = sp_ienv(7);
  iVar15 = sp_ienv((uint)(iVar14 <= iVar15) * 4 + 3);
  iVar16 = sp_ienv(4);
  iVar17 = sp_ienv(5);
  iVar18 = iVar16 + iVar15;
  iVar41 = w + jcol;
  lVar27 = (long)nseg;
  iVar32 = 0;
  iVar14 = 0;
  if (0 < nseg) {
    iVar14 = nseg;
  }
  for (; iVar32 != iVar14; iVar32 = iVar32 + 1) {
    lVar27 = lVar27 + -1;
    iVar2 = segrep[lVar27];
    iVar3 = piVar8[piVar9[iVar2]];
    iVar29 = iVar2 - iVar3;
    iVar35 = iVar29 + 1;
    iVar4 = piVar11[iVar3];
    ldm = piVar11[(long)iVar3 + 1] - iVar4;
    nrow = ldm - iVar35;
    iVar38 = iVar4 + iVar29 + 1;
    iVar25 = ldm + 1;
    lVar20 = (long)(iVar4 + iVar29);
    iVar42 = ldm * iVar29 + iVar29 + 1;
    if ((iVar35 < iVar17) || ((int)nrow <= iVar16)) {
      uVar40 = 0;
      if (0 < (int)nrow) {
        uVar40 = (ulong)nrow;
      }
      lVar28 = (long)iVar38;
      piVar21 = repfnz;
      pdVar37 = dense;
      for (iVar38 = jcol; iVar38 < iVar41; iVar38 = iVar38 + 1) {
        iVar35 = piVar21[iVar2];
        if (iVar35 != -1) {
          uVar30 = (iVar2 - iVar35) + 1;
          iVar26 = piVar13[iVar3];
          pfVar7[0x13] = (float)(int)((iVar2 - iVar35) * uVar30) + pfVar7[0x13];
          pfVar7[0x14] = (float)(int)(nrow * 2 * uVar30) + pfVar7[0x14];
          uVar31 = iVar2 - iVar35;
          if (uVar31 == 0) {
            iVar35 = piVar11[(long)iVar3 + 1];
            dVar45 = pdVar37[piVar10[lVar20]];
            pdVar24 = (double *)((long)pvVar12 + (long)(iVar26 + iVar42) * 8);
            for (lVar33 = lVar28; lVar33 < iVar35; lVar33 = lVar33 + 1) {
              pdVar37[piVar10[lVar33]] = *pdVar24 * -dVar45 + pdVar37[piVar10[lVar33]];
              pdVar24 = pdVar24 + 1;
            }
          }
          else if ((int)uVar31 < 3) {
            iVar35 = piVar10[lVar20];
            iVar26 = iVar26 + iVar29 * iVar25;
            iVar5 = piVar10[lVar20 + -1];
            dVar45 = pdVar37[iVar5];
            lVar33 = (long)(iVar26 - ldm);
            if (uVar30 == 2) {
              dVar43 = pdVar37[iVar35] - *(double *)((long)pvVar12 + lVar33 * 8) * dVar45;
              pdVar37[iVar35] = dVar43;
              iVar35 = piVar11[(long)iVar3 + 1];
              for (lVar39 = 0; lVar28 + lVar39 < (long)iVar35; lVar39 = lVar39 + 1) {
                pdVar37[piVar10[lVar28 + lVar39]] =
                     pdVar37[piVar10[lVar28 + lVar39]] -
                     (*(double *)((long)pvVar12 + lVar39 * 8 + (long)iVar26 * 8 + 8) * dVar43 +
                     *(double *)((long)pvVar12 + lVar39 * 8 + lVar33 * 8 + 8) * dVar45);
              }
            }
            else {
              dVar43 = pdVar37[piVar10[lVar20 + -2]];
              lVar39 = (long)((iVar26 - ldm) - ldm);
              dVar45 = dVar45 - *(double *)((long)pvVar12 + lVar39 * 8 + -8) * dVar43;
              dVar44 = (pdVar37[iVar35] - *(double *)((long)pvVar12 + lVar33 * 8) * dVar45) -
                       *(double *)((long)pvVar12 + lVar39 * 8) * dVar43;
              pdVar37[iVar35] = dVar44;
              pdVar37[iVar5] = dVar45;
              iVar35 = piVar11[(long)iVar3 + 1];
              for (lVar39 = 0; lVar28 + lVar39 < (long)iVar35; lVar39 = lVar39 + 1) {
                pdVar37[piVar10[lVar28 + lVar39]] =
                     pdVar37[piVar10[lVar28 + lVar39]] -
                     (*(double *)((long)pvVar12 + lVar39 * 8 + lVar33 * 8 + (long)ldm * -8 + 8) *
                      dVar43 + *(double *)((long)pvVar12 + lVar39 * 8 + (long)iVar26 * 8 + 8) *
                               dVar44 + *(double *)((long)pvVar12 + lVar39 * 8 + lVar33 * 8 + 8) *
                                        dVar45);
              }
            }
          }
          else {
            piVar1 = piVar10 + (iVar4 + (iVar35 - iVar3));
            for (uVar34 = 0; uVar34 <= uVar31; uVar34 = uVar34 + 1) {
              tempv[uVar34] = pdVar37[piVar1[uVar34]];
            }
            iVar26 = iVar26 + (iVar35 - iVar3) * iVar25;
            dlsolve(ldm,uVar30,(double *)((long)pvVar12 + (long)iVar26 * 8),tempv);
            pdVar24 = tempv + uVar30;
            dmatvec(ldm,nrow,uVar30,(double *)((long)pvVar12 + (long)(int)(iVar26 + uVar30) * 8),
                    tempv,pdVar24);
            piVar23 = piVar1;
            for (uVar34 = 0; uVar34 <= uVar31; uVar34 = uVar34 + 1) {
              pdVar37[piVar1[uVar34]] = tempv[uVar34];
              tempv[uVar34] = 0.0;
              piVar23 = piVar23 + 1;
            }
            for (uVar34 = 0; uVar40 != uVar34; uVar34 = uVar34 + 1) {
              pdVar37[*piVar23] = pdVar37[*piVar23] - pdVar24[uVar34];
              pdVar24[uVar34] = 0.0;
              piVar23 = piVar23 + 1;
            }
          }
        }
        piVar21 = piVar21 + m;
        pdVar37 = pdVar37 + m;
      }
    }
    else {
      lVar28 = (long)iVar38;
      piVar21 = repfnz;
      pdVar24 = tempv;
      pdVar37 = dense;
      for (iVar26 = jcol; iVar26 < iVar41; iVar26 = iVar26 + 1) {
        iVar5 = piVar21[iVar2];
        if (iVar5 != -1) {
          ncol = (iVar2 - iVar5) + 1;
          iVar19 = piVar13[iVar3];
          pfVar7[0x13] = (float)((iVar2 - iVar5) * ncol) + pfVar7[0x13];
          pfVar7[0x14] = (float)(int)(nrow * 2 * ncol) + pfVar7[0x14];
          uVar30 = iVar2 - iVar5;
          if (uVar30 == 0) {
            iVar5 = piVar11[(long)iVar3 + 1];
            dVar45 = pdVar37[piVar10[lVar20]];
            pdVar22 = (double *)((long)pvVar12 + (long)(iVar19 + iVar42) * 8);
            for (lVar33 = lVar28; lVar33 < iVar5; lVar33 = lVar33 + 1) {
              pdVar37[piVar10[lVar33]] = *pdVar22 * -dVar45 + pdVar37[piVar10[lVar33]];
              pdVar22 = pdVar22 + 1;
            }
          }
          else if ((int)uVar30 < 3) {
            iVar5 = piVar10[lVar20];
            iVar6 = piVar10[lVar20 + -1];
            dVar45 = pdVar37[iVar6];
            iVar19 = iVar19 + iVar29 * iVar25;
            lVar33 = (long)(iVar19 - ldm);
            if (ncol == 2) {
              dVar43 = pdVar37[iVar5] - *(double *)((long)pvVar12 + lVar33 * 8) * dVar45;
              pdVar37[iVar5] = dVar43;
              iVar5 = piVar11[(long)iVar3 + 1];
              for (lVar39 = 0; lVar28 + lVar39 < (long)iVar5; lVar39 = lVar39 + 1) {
                pdVar37[piVar10[lVar28 + lVar39]] =
                     pdVar37[piVar10[lVar28 + lVar39]] -
                     (*(double *)((long)pvVar12 + lVar39 * 8 + (long)iVar19 * 8 + 8) * dVar43 +
                     *(double *)((long)pvVar12 + lVar39 * 8 + lVar33 * 8 + 8) * dVar45);
              }
            }
            else {
              dVar43 = pdVar37[piVar10[lVar20 + -2]];
              lVar39 = (long)((iVar19 - ldm) - ldm);
              dVar45 = dVar45 - *(double *)((long)pvVar12 + lVar39 * 8 + -8) * dVar43;
              dVar44 = (pdVar37[iVar5] - *(double *)((long)pvVar12 + lVar33 * 8) * dVar45) -
                       *(double *)((long)pvVar12 + lVar39 * 8) * dVar43;
              pdVar37[iVar5] = dVar44;
              pdVar37[iVar6] = dVar45;
              iVar5 = piVar11[(long)iVar3 + 1];
              for (lVar39 = 0; lVar28 + lVar39 < (long)iVar5; lVar39 = lVar39 + 1) {
                pdVar37[piVar10[lVar28 + lVar39]] =
                     pdVar37[piVar10[lVar28 + lVar39]] -
                     (*(double *)((long)pvVar12 + lVar39 * 8 + lVar33 * 8 + (long)ldm * -8 + 8) *
                      dVar43 + *(double *)((long)pvVar12 + lVar39 * 8 + (long)iVar19 * 8 + 8) *
                               dVar44 + *(double *)((long)pvVar12 + lVar39 * 8 + lVar33 * 8 + 8) *
                                        dVar45);
              }
            }
          }
          else {
            for (uVar40 = 0; uVar40 <= uVar30; uVar40 = uVar40 + 1) {
              pdVar24[uVar40] = pdVar37[piVar10[(long)(iVar4 + (iVar5 - iVar3)) + uVar40]];
            }
            dlsolve(ldm,ncol,(double *)
                             ((long)pvVar12 + (long)(iVar19 + (iVar5 - iVar3) * iVar25) * 8),pdVar24
                   );
          }
        }
        piVar21 = piVar21 + m;
        pdVar37 = pdVar37 + m;
        pdVar24 = pdVar24 + iVar18;
      }
      uVar30 = 0;
      while ((int)uVar30 < (int)nrow) {
        uVar36 = uVar30 + iVar16;
        uVar31 = uVar36;
        if ((int)nrow < (int)uVar36) {
          uVar31 = nrow;
        }
        iVar25 = uVar31 - uVar30;
        if (iVar16 < (int)(uVar31 - uVar30)) {
          iVar25 = iVar16;
        }
        iVar29 = piVar13[iVar3];
        piVar21 = repfnz;
        pdVar37 = dense;
        pdVar24 = tempv + iVar15;
        local_150 = tempv;
        for (iVar42 = jcol; iVar42 < iVar41; iVar42 = iVar42 + 1) {
          iVar26 = piVar21[iVar2];
          if ((iVar26 != -1) && (2 < iVar2 - iVar26)) {
            dmatvec(ldm,iVar25,(iVar2 - iVar26) + 1,
                    (double *)
                    ((long)pvVar12 +
                    (long)(int)((iVar26 - iVar3) * ldm + uVar30 + iVar35 + iVar29) * 8),local_150,
                    local_150 + iVar15);
            for (lVar20 = 0; lVar20 < iVar25; lVar20 = lVar20 + 1) {
              pdVar37[piVar10[iVar38 + lVar20]] =
                   pdVar37[piVar10[iVar38 + lVar20]] - pdVar24[lVar20];
              pdVar24[lVar20] = 0.0;
            }
          }
          piVar21 = piVar21 + m;
          pdVar37 = pdVar37 + m;
          local_150 = local_150 + iVar18;
          pdVar24 = pdVar24 + iVar18;
        }
        iVar38 = iVar38 + iVar16;
        uVar30 = uVar36;
      }
      pdVar24 = tempv;
      piVar21 = repfnz;
      pdVar37 = dense;
      for (iVar38 = jcol; iVar38 < iVar41; iVar38 = iVar38 + 1) {
        iVar25 = piVar21[iVar2];
        if ((iVar25 != -1) && (2 < iVar2 - iVar25)) {
          for (uVar40 = 0; uVar40 <= (uint)(iVar2 - iVar25); uVar40 = uVar40 + 1) {
            pdVar37[piVar10[(long)(iVar25 + (iVar4 - iVar3)) + uVar40]] = pdVar24[uVar40];
            pdVar24[uVar40] = 0.0;
          }
        }
        piVar21 = piVar21 + m;
        pdVar37 = pdVar37 + m;
        pdVar24 = pdVar24 + iVar18;
      }
    }
  }
  return;
}

Assistant:

void
dpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    double     *dense,     /* out, of size n by w */
	    double     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    double       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    double       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    double       *dense_col;  /* dense[] for a column in the panel */
    double       *tempv1;             /* Used in 1-D update */
    double       *TriTmp, *MatvecTmp; /* used in 2-D update */
    double      zero = 0.0;
    double      one = 1.0;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (double *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += segsze * (segsze - 1);
		ops[GEMV] += 2 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
			dense_col[irow] -= ukj * lusup[luptr];
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
			ukj -= ukj1 * lusup[luptr1];
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    dense_col[irow] -= (ukj*lusup[luptr]
						+ ukj1*lusup[luptr1]);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
			ukj1 -= ukj2 * lusup[luptr2-1];
			ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    dense_col[irow] -= ( ukj*lusup[luptr]
                             + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    dlsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    SGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    dgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    dmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
			dense_col[irow] -= MatvecTmp[i];
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += segsze * (segsze - 1);
		ops[GEMV] += 2 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
			dense_col[irow] -= ukj * lusup[luptr];
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
			ukj -= ukj1 * lusup[luptr1];
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    dense_col[irow] -= (ukj*lusup[luptr]
						+ ukj1*lusup[luptr1]);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
			ukj1 -= ukj2 * lusup[luptr2-1];
			ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    dense_col[irow] -= ( ukj*lusup[luptr]
                             + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    SGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    dgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    dlsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    dmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
			dense_col[irow] -= tempv1[i];
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}